

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O2

int __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::shutdown
          (reactive_socket_service<asio::ip::tcp> *this,int __fd,int __how)

{
  int *in_RCX;
  undefined4 in_register_00000034;
  
  socket_ops::shutdown
            ((socket_ops *)(ulong)*(uint *)CONCAT44(in_register_00000034,__fd),__how,(int)in_RCX);
  return *in_RCX;
}

Assistant:

asio::error_code shutdown(base_implementation_type& impl,
      socket_base::shutdown_type what, asio::error_code& ec)
  {
    socket_ops::shutdown(impl.socket_, what, ec);

    ASIO_ERROR_LOCATION(ec);
    return ec;
  }